

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

int container_get_index(container_t *c,uint8_t type,uint16_t x)

{
  int iVar1;
  container_t *pcVar2;
  uint8_t in_SIL;
  container_t *in_RDI;
  undefined1 unaff_retaddr;
  uint16_t uVar3;
  uint8_t local_11 [7];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_11[0] = in_SIL;
  pcVar2 = container_unwrap_shared(in_RDI,local_11);
  unique0x100000c2 = pcVar2;
  if (local_11[0] == '\x01') {
    iVar1 = bitset_container_get_index((bitset_container_t *)c,uVar3);
  }
  else if (local_11[0] == '\x02') {
    uVar3 = (uint16_t)((ulong)pcVar2 >> 0x30);
    iVar1 = array_container_get_index
                      ((array_container_t *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar3);
  }
  else {
    iVar1 = run_container_get_index((run_container_t *)c,uVar3);
  }
  return iVar1;
}

Assistant:

static inline int container_get_index(const container_t *c, uint8_t type,
                                      uint16_t x) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_get_index(const_CAST_bitset(c), x);
        case ARRAY_CONTAINER_TYPE:
            return array_container_get_index(const_CAST_array(c), x);
        case RUN_CONTAINER_TYPE:
            return run_container_get_index(const_CAST_run(c), x);
        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return false;
}